

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_randomseed(lua_State *L)

{
  int iVar1;
  uint uVar2;
  unsigned_long *state;
  lua_Unsigned n1;
  lua_Unsigned n2;
  
  state = (unsigned_long *)lua_touserdata(L,-0xf4629);
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    uVar2 = luaL_makeseed(L);
    n1 = (lua_Unsigned)uVar2;
    n2 = nextrand(state);
  }
  else {
    n1 = luaL_checkinteger(L,1);
    n2 = luaL_optinteger(L,2,0);
  }
  setseed(L,state,n1,n2);
  return 2;
}

Assistant:

static int math_randomseed (lua_State *L) {
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  lua_Unsigned n1, n2;
  if (lua_isnone(L, 1)) {
    n1 = luaL_makeseed(L);  /* "random" seed */
    n2 = I2UInt(nextrand(state->s));  /* in case seed is not that random... */
  }
  else {
    n1 = l_castS2U(luaL_checkinteger(L, 1));
    n2 = l_castS2U(luaL_optinteger(L, 2, 0));
  }
  setseed(L, state->s, n1, n2);
  return 2;  /* return seeds */
}